

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O2

void __thiscall Omega_h::Read<long>::Read(Read<long> *this,LO size_in,long value,string *name_in)

{
  Write<long> local_20;
  
  Write<long>::Write(&local_20,size_in,value,name_in);
  Write<long>::Write((Write<int> *)this,(Write<int> *)&local_20);
  Write<long>::~Write(&local_20);
  return;
}

Assistant:

Read<T>::Read(LO size_in, T value, std::string const& name_in)
    : Read<T>(Write<T>(size_in, value, name_in)) {}